

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O2

bool __thiscall
glcts::GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest::checkResult
          (GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest *this,CapturedVaryings *captured_data
          ,uint index,uint tex_size)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TestLog *pTVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  void *__buf;
  GLint y_offsets [4];
  GLint x_offsets [4];
  GLint expected_values_3 [4];
  GLint expected_values_2 [4];
  GLint expected_values_1 [4];
  GLint expected_values_0 [4];
  allocator<char> local_25a;
  allocator<char> local_259;
  GLint local_258 [4];
  GLint local_248 [4];
  uint auStack_238 [4];
  int aiStack_228 [4];
  int aiStack_218 [4];
  int aiStack_208 [6];
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  ulong __n;
  
  local_248[0] = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
                 super_GPUShader5TextureGatherOffsetTestBase.m_min_texture_gather_offset;
  local_248[1] = local_248[0];
  local_248[2] = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
                 super_GPUShader5TextureGatherOffsetTestBase.m_max_texture_gather_offset;
  local_248[3] = local_248[2];
  local_258[0] = local_248[0];
  local_258[1] = local_248[2];
  local_258[2] = local_248[0];
  local_258[3] = local_248[2];
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    if (local_248[lVar10] < 0) {
      local_248[lVar10] = local_248[lVar10] % (int)tex_size + tex_size;
    }
    if (local_258[lVar10] < 0) {
      local_258[lVar10] = local_258[lVar10] % (int)tex_size + tex_size;
    }
  }
  iVar2 = captured_data->without_offset_0[3];
  iVar3 = captured_data->without_offset_1[3];
  iVar4 = captured_data->without_offset_2[3];
  iVar5 = captured_data->without_offset_3[3];
  __n = 4;
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 4) {
    *(int *)((long)aiStack_208 + lVar10) =
         (iVar2 + *(int *)((long)local_248 + lVar10)) % (int)tex_size;
    *(int *)((long)aiStack_218 + lVar10) =
         (iVar3 + *(int *)((long)local_258 + lVar10)) % (int)tex_size;
    uVar9 = *(int *)((long)local_248 + lVar10) + iVar4;
    __n = (ulong)uVar9;
    *(int *)((long)aiStack_228 + lVar10) = (int)uVar9 % (int)tex_size;
    *(int *)((long)auStack_238 + lVar10) =
         (*(int *)((long)local_258 + lVar10) + iVar5) % (int)tex_size;
  }
  uVar7 = 0;
  do {
    uVar8 = uVar7;
    if (uVar8 == 4) goto LAB_00ca3e2b;
    if (((captured_data->with_offset_0[uVar8] != aiStack_208[uVar8]) ||
        (captured_data->with_offset_1[uVar8] != aiStack_218[uVar8])) ||
       (captured_data->with_offset_2[uVar8] != aiStack_228[uVar8])) break;
    __n = (ulong)(uint)captured_data->with_offset_3[uVar8];
    uVar7 = uVar8 + 1;
  } while (captured_data->with_offset_3[uVar8] == auStack_238[uVar8]);
  pTVar6 = ((this->super_GPUShader5TextureGatherOffsetColorTestBase).
            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Invalid result",&local_259);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,fixed_sample_locations_values + 1,&local_25a);
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1d0,&local_1f0);
  tcu::LogSection::write((LogSection *)local_1b0,(int)pTVar6,__buf,__n);
  tcu::LogSection::~LogSection((LogSection *)local_1b0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  GPUShader5TextureGatherOffsetTestBase::logCoordinates
            ((GPUShader5TextureGatherOffsetTestBase *)this,index);
  local_1b0._0_8_ =
       ((this->super_GPUShader5TextureGatherOffsetColorTestBase).
        super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.super_TestNode
       .m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Texture size: ");
  std::ostream::operator<<(poVar1,tex_size);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ =
       ((this->super_GPUShader5TextureGatherOffsetColorTestBase).
        super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.super_TestNode
       .m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Offsets: ");
  std::operator<<((ostream *)poVar1,"(");
  std::ostream::operator<<(poVar1,local_248[0]);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,local_258[0]);
  std::operator<<((ostream *)poVar1,") ");
  std::operator<<((ostream *)poVar1,"(");
  std::ostream::operator<<(poVar1,local_248[1]);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,local_258[1]);
  std::operator<<((ostream *)poVar1,") ");
  std::operator<<((ostream *)poVar1,"(");
  std::ostream::operator<<(poVar1,local_248[2]);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,local_258[2]);
  std::operator<<((ostream *)poVar1,") ");
  std::operator<<((ostream *)poVar1,"(");
  std::ostream::operator<<(poVar1,local_248[3]);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,local_258[3]);
  std::operator<<((ostream *)poVar1,") ");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  GPUShader5TextureGatherOffsetColorTestBase::logVaryings
            (&this->super_GPUShader5TextureGatherOffsetColorTestBase,captured_data);
  tcu::TestLog::endSection
            (((this->super_GPUShader5TextureGatherOffsetColorTestBase).
              super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
LAB_00ca3e2b:
  return 3 < uVar8;
}

Assistant:

bool GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest::checkResult(const CapturedVaryings& captured_data,
																	  unsigned int index, unsigned int tex_size)
{
	/* Signed int value has to be used with operator % in order to work as expected */
	const glw::GLint texture_size = (glw::GLint)tex_size;

	/* X and Y offsets */
	glw::GLint x_offsets[m_n_components_per_varying] = {
		m_min_texture_gather_offset, m_min_texture_gather_offset, m_max_texture_gather_offset,
		m_max_texture_gather_offset,
	};

	glw::GLint y_offsets[m_n_components_per_varying] = {
		m_min_texture_gather_offset, m_max_texture_gather_offset, m_min_texture_gather_offset,
		m_max_texture_gather_offset,
	};

	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		/* Roll x offsets around left edge when negative */
		if (0 > x_offsets[i])
		{
			x_offsets[i] = x_offsets[i] % texture_size;
			x_offsets[i] += texture_size;
		}

		/* Roll y offsets around top edge when negative */
		if (0 > y_offsets[i])
		{
			y_offsets[i] = y_offsets[i] % texture_size;
			y_offsets[i] += texture_size;
		}
	}

	/* Storage for expected values of with_offset varyings */
	glw::GLint expected_values_0[m_n_components_per_varying];
	glw::GLint expected_values_1[m_n_components_per_varying];
	glw::GLint expected_values_2[m_n_components_per_varying];
	glw::GLint expected_values_3[m_n_components_per_varying];

	/* Calculate expected values of with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		expected_values_0[i] = ((x_offsets[i] + captured_data.without_offset_0[3]) % texture_size);
		expected_values_1[i] = ((y_offsets[i] + captured_data.without_offset_1[3]) % texture_size);
		expected_values_2[i] = ((x_offsets[i] + captured_data.without_offset_2[3]) % texture_size);
		expected_values_3[i] = ((y_offsets[i] + captured_data.without_offset_3[3]) % texture_size);
	}

	/* Verify that expected_values match those in with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		if ((captured_data.with_offset_0[i] != expected_values_0[i]) ||
			(captured_data.with_offset_1[i] != expected_values_1[i]) ||
			(captured_data.with_offset_2[i] != expected_values_2[i]) ||
			(captured_data.with_offset_3[i] != expected_values_3[i]))
		{
			/* Log invalid results */
			m_testCtx.getLog() << tcu::TestLog::Section("Invalid result", "");

			logCoordinates(index);

			m_testCtx.getLog() << tcu::TestLog::Message << "Texture size: " << texture_size << tcu::TestLog::EndMessage;

			m_testCtx.getLog() << tcu::TestLog::Message << "Offsets: "
							   << "(" << x_offsets[0] << ", " << y_offsets[0] << ") "
							   << "(" << x_offsets[1] << ", " << y_offsets[1] << ") "
							   << "(" << x_offsets[2] << ", " << y_offsets[2] << ") "
							   << "(" << x_offsets[3] << ", " << y_offsets[3] << ") " << tcu::TestLog::EndMessage;

			logVaryings(captured_data);

			m_testCtx.getLog() << tcu::TestLog::EndSection;

			/* Done */
			return false;
		}
	}

	/* Done */
	return true;
}